

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmip.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Kmip::deleteRole
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Kmip *this,Path *scope,Path *role)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Client *client;
  long *plVar3;
  size_type *psVar4;
  string local_d0;
  string local_b0;
  Path local_90;
  Url local_70;
  string local_50;
  
  client = *(Client **)this;
  Vault::operator+(&local_50,"scope/",scope);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0.field_2._8_8_ = plVar3[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar4;
    local_b0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Vault::operator+(&local_d0,&local_b0,role);
  paVar1 = &local_90.value_.field_2;
  paVar2 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar2) {
    local_90.value_.field_2._8_8_ = local_d0.field_2._8_8_;
    local_90.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.value_._M_dataplus._M_p = local_d0._M_dataplus._M_p;
  }
  local_90.value_.field_2._M_allocated_capacity._1_7_ = local_d0.field_2._M_allocated_capacity._1_7_
  ;
  local_90.value_.field_2._M_local_buf[0] = local_d0.field_2._M_local_buf[0];
  local_90.value_._M_string_length = local_d0._M_string_length;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  getUrl(&local_70,this,&local_90);
  HttpConsumer::del(__return_storage_ptr__,client,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.value_._M_dataplus._M_p != &local_70.value_.field_2) {
    operator_delete(local_70.value_._M_dataplus._M_p,
                    local_70.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.value_._M_dataplus._M_p,
                    local_90.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Kmip::deleteRole(const Path &scope,
                                                   const Path &role) {
  return HttpConsumer::del(client_,
                           getUrl(Path{"scope/" + scope + "/role/" + role}));
}